

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.cpp
# Opt level: O3

void __thiscall lab_employees::getGroups(lab_employees *this)

{
  uint uVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\tNumber of Groups : ",0x15);
  std::ostream::operator<<((ostream *)&std::cout,(this->super_Person).num_groups);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\t Groups : ",0xc);
  if (0 < (this->super_Person).num_groups) {
    uVar2 = 0;
    do {
      std::ostream::operator<<((ostream *)&std::cout,(this->super_Person).groups[uVar2]);
      uVar2 = uVar2 + 1;
      uVar1 = (this->super_Person).num_groups;
      if (uVar2 != uVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        uVar1 = (this->super_Person).num_groups;
      }
    } while ((long)uVar2 < (long)(int)uVar1);
  }
  return;
}

Assistant:

void lab_employees::getGroups(){

    cout<<"\n\tNumber of Groups : "<<this->num_groups;
    cout<<"\n\t Groups : ";
    for(int i=0;i<this->num_groups;i++){
        cout<<this->groups[i];
        if(i+1 != this->num_groups){
            cout<<", ";
        }
    }


}